

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

void boost::detail::function::
     void_function_obj_invoker0<boost::_bi::bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>,_void>
     ::invoke(function_buffer *function_obj_ptr)

{
  undefined8 *in_RDI;
  bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
  *f;
  
  _bi::
  bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
  ::operator()((bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
                *)*in_RDI);
  return;
}

Assistant:

static BOOST_FUNCTION_VOID_RETURN_TYPE
        invoke(function_buffer& function_obj_ptr BOOST_FUNCTION_COMMA
               BOOST_FUNCTION_PARMS)

        {
          FunctionObj* f;
          if (function_allows_small_object_optimization<FunctionObj>::value)
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.data);
          else
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.members.obj_ptr);
          BOOST_FUNCTION_RETURN((*f)(BOOST_FUNCTION_ARGS));
        }